

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainClient.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Client *this;
  thread thr_recv;
  thread thr_send;
  Client *client;
  thread local_50;
  thread local_48;
  Client *local_40;
  Client **local_38;
  string local_30;
  
  this = (Client *)operator_new(0x90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"127.0.0.1",(allocator<char> *)&local_48);
  Client::Client(this,&local_30,0x15c8);
  std::__cxx11::string::~string((string *)&local_30);
  local_40 = this;
  (**(this->super_TCP)._vptr_TCP)(this);
  local_50._M_id._M_thread = (id)(id)&local_40;
  std::thread::thread<void(&)(Client**),Client**,void>
            (&local_48,SendMsgHandler,(Client ***)&local_50);
  local_38 = &local_40;
  std::thread::thread<void(&)(Client**),Client**,void>(&local_50,ReceiveMsgHandler,&local_38);
  std::thread::join();
  std::thread::join();
  (*(local_40->super_TCP)._vptr_TCP[3])();
  std::thread::~thread(&local_50);
  std::thread::~thread(&local_48);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    Client *client = new Client("127.0.0.1", 5576);
    client->Connect();

    std::thread thr_send = std::thread(SendMsgHandler, &client);
    std::thread thr_recv = std::thread(ReceiveMsgHandler, &client);

    thr_send.join();
    thr_recv.join();

    client->Close();

    return 0;
}